

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

void compress_binning(hts_idx_t *idx,int i)

{
  kh_bin_t *h;
  bins_t *pbVar1;
  hts_pair64_t *phVar2;
  khint_t kVar3;
  bins_t *pbVar4;
  hts_pair64_t *phVar5;
  bins_t *p_1;
  khint_t kp;
  bins_t *q;
  bins_t *p;
  uint start;
  int m;
  int l;
  khint_t k;
  bidx_t *bidx;
  int i_local;
  hts_idx_t *idx_local;
  
  h = idx->bidx[i];
  if (h != (kh_bin_t *)0x0) {
    for (start = idx->n_lvls; 0 < (int)start; start = start - 1) {
      for (m = 0; m != h->n_buckets; m = m + 1) {
        if ((((h->flags[(uint)m >> 4] >> (sbyte)((m & 0xfU) << 1) & 3) == 0) &&
            (h->keys[(uint)m] < (uint)idx->n_bins)) &&
           ((uint)(((1 << ((char)(start << 1) + (char)start & 0x1fU)) + -1) / 7) <= h->keys[(uint)m]
           )) {
          pbVar1 = h->vals;
          if (((int)start < idx->n_lvls) && (1 < pbVar1[(uint)m].n)) {
            ks_introsort__off((long)pbVar1[(uint)m].n,pbVar1[(uint)m].list);
          }
          if (((pbVar1[(uint)m].list[pbVar1[(uint)m].n + -1].v >> 0x10) -
               ((pbVar1[(uint)m].list)->u >> 0x10) < 0x10000) &&
             (kVar3 = kh_get_bin(h,h->keys[(uint)m] - 1 >> 3), kVar3 != h->n_buckets)) {
            pbVar4 = h->vals + kVar3;
            if (pbVar4->m < pbVar4->n + pbVar1[(uint)m].n) {
              pbVar4->m = pbVar4->n + pbVar1[(uint)m].n;
              pbVar4->m = pbVar4->m + -1;
              pbVar4->m = pbVar4->m >> 1 | pbVar4->m;
              pbVar4->m = pbVar4->m >> 2 | pbVar4->m;
              pbVar4->m = pbVar4->m >> 4 | pbVar4->m;
              pbVar4->m = pbVar4->m >> 8 | pbVar4->m;
              pbVar4->m = pbVar4->m >> 0x10 | pbVar4->m;
              pbVar4->m = pbVar4->m + 1;
              phVar5 = (hts_pair64_t *)realloc(pbVar4->list,(long)pbVar4->m << 4);
              pbVar4->list = phVar5;
            }
            memcpy(pbVar4->list + pbVar4->n,pbVar1[(uint)m].list,(long)pbVar1[(uint)m].n << 4);
            pbVar4->n = pbVar1[(uint)m].n + pbVar4->n;
            free(pbVar1[(uint)m].list);
            kh_del_bin(h,m);
          }
        }
      }
    }
    kVar3 = kh_get_bin(h,0);
    if (kVar3 != h->n_buckets) {
      ks_introsort__off((long)h->vals[kVar3].n,h->vals[kVar3].list);
    }
    for (m = 0; m != h->n_buckets; m = m + 1) {
      if (((h->flags[(uint)m >> 4] >> (sbyte)((m & 0xfU) << 1) & 3) == 0) &&
         (h->keys[(uint)m] < (uint)idx->n_bins)) {
        pbVar1 = h->vals;
        p._4_4_ = 0;
        for (start = 1; (int)start < pbVar1[(uint)m].n; start = start + 1) {
          if (pbVar1[(uint)m].list[p._4_4_].v >> 0x10 < pbVar1[(uint)m].list[(int)start].u >> 0x10)
          {
            phVar5 = pbVar1[(uint)m].list;
            p._4_4_ = p._4_4_ + 1;
            phVar2 = pbVar1[(uint)m].list;
            phVar5[p._4_4_].u = phVar2[(int)start].u;
            phVar5[p._4_4_].v = phVar2[(int)start].v;
          }
          else if (pbVar1[(uint)m].list[p._4_4_].v < pbVar1[(uint)m].list[(int)start].v) {
            pbVar1[(uint)m].list[p._4_4_].v = pbVar1[(uint)m].list[(int)start].v;
          }
        }
        pbVar1[(uint)m].n = p._4_4_ + 1;
      }
    }
  }
  return;
}

Assistant:

static void compress_binning(hts_idx_t *idx, int i)
{
    bidx_t *bidx = idx->bidx[i];
    khint_t k;
    int l, m;
    if (bidx == 0) return;
    // merge a bin to its parent if the bin is too small
    for (l = idx->n_lvls; l > 0; --l) {
        unsigned start = hts_bin_first(l);
        for (k = kh_begin(bidx); k != kh_end(bidx); ++k) {
            bins_t *p, *q;
            if (!kh_exist(bidx, k) || kh_key(bidx, k) >= idx->n_bins || kh_key(bidx, k) < start) continue;
            p = &kh_value(bidx, k);
            if (l < idx->n_lvls && p->n > 1) ks_introsort(_off, p->n, p->list);
            if ((p->list[p->n - 1].v>>16) - (p->list[0].u>>16) < HTS_MIN_MARKER_DIST) {
                khint_t kp;
                kp = kh_get(bin, bidx, hts_bin_parent(kh_key(bidx, k)));
                if (kp == kh_end(bidx)) continue;
                q = &kh_val(bidx, kp);
                if (q->n + p->n > q->m) {
                    q->m = q->n + p->n;
                    kroundup32(q->m);
                    q->list = (hts_pair64_t*)realloc(q->list, q->m * sizeof(hts_pair64_t));
                }
                memcpy(q->list + q->n, p->list, p->n * sizeof(hts_pair64_t));
                q->n += p->n;
                free(p->list);
                kh_del(bin, bidx, k);
            }
        }
    }
    k = kh_get(bin, bidx, 0);
    if (k != kh_end(bidx)) ks_introsort(_off, kh_val(bidx, k).n, kh_val(bidx, k).list);
    // merge adjacent chunks that start from the same BGZF block
    for (k = kh_begin(bidx); k != kh_end(bidx); ++k) {
        bins_t *p;
        if (!kh_exist(bidx, k) || kh_key(bidx, k) >= idx->n_bins) continue;
        p = &kh_value(bidx, k);
        for (l = 1, m = 0; l < p->n; ++l) {
            if (p->list[m].v>>16 >= p->list[l].u>>16) {
                if (p->list[m].v < p->list[l].v) p->list[m].v = p->list[l].v;
            } else p->list[++m] = p->list[l];
        }
        p->n = m + 1;
    }
}